

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nike.cpp
# Opt level: O2

void __thiscall NikeShoes::Show(NikeShoes *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_b4f1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Shoes).param_.size);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_3cc7);
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_Shoes).param_);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void NikeShoes::Show() {
    std::cout << "耐克球鞋, 大小："<<this->param_.size<<", 颜色："<<this->param_.color<<std::endl;
}